

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

bool __thiscall
ON_wString::EqualOrdinal(ON_wString *this,ON_wString *other_string,bool bOrdinalIgnoreCase)

{
  bool bVar1;
  int element_count1;
  int iVar2;
  wchar_t *string1;
  wchar_t *string2;
  
  element_count1 = Length(this);
  iVar2 = Length(other_string);
  if (element_count1 == iVar2) {
    string1 = operator_cast_to_wchar_t_(this);
    string2 = operator_cast_to_wchar_t_(other_string);
    bVar1 = EqualOrdinal(string1,element_count1,string2,element_count1,bOrdinalIgnoreCase);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_wString::EqualOrdinal(
  const ON_wString& other_string,
  bool bOrdinalIgnoreCase
  ) const
{
  const int length = Length();
  return
    (length == other_string.Length())
    && ON_wString::EqualOrdinal(
    static_cast< const wchar_t* >(*this),
    length,
    static_cast< const wchar_t* >(other_string),
    length,
    bOrdinalIgnoreCase
    );
}